

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O0

int Dau_DsdMergeStatus_rec(char *pStr,char **p,int *pMatches,int nShared,int *pStatus)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *q_1;
  char *pOld;
  int local_50;
  int nTotal;
  int nPure;
  int Status;
  char *pTemp;
  char *q;
  int *pStatus_local;
  int nShared_local;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  
  if (**p == '!') {
    pStatus[(long)*p - (long)pStr] = -1;
    *p = *p + 1;
  }
  while( true ) {
    if (((**p < 'A') || (bVar2 = true, 'F' < **p)) && (bVar2 = false, '/' < **p)) {
      bVar2 = **p < ':';
    }
    if (!bVar2) break;
    pStatus[(long)*p - (long)pStr] = -1;
    *p = *p + 1;
  }
  if ((**p == '<') && (iVar3 = pMatches[(long)*p - (long)pStr], pStr[(long)iVar3 + 1] == '{')) {
    _nPure = *p;
    *p = pStr + (long)iVar3 + 1;
    for (; _nPure < pStr + (long)iVar3 + 1; _nPure = _nPure + 1) {
      pStatus[(long)_nPure - (long)pStr] = -1;
    }
  }
  if ((**p < 'a') || ('z' < **p)) {
    if ((**p != '(') && (((**p != '[' && (**p != '<')) && (**p != '{')))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauMerge.c"
                    ,0x157,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    local_50 = 0;
    pOld._4_4_ = 0;
    pcVar1 = *p;
    pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
    if ((int)*pcVar4 != **p + 1 + (uint)(**p != '(')) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauMerge.c"
                    ,0x143,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    *p = *p + 1;
    while (*p < pcVar4) {
      iVar3 = Dau_DsdMergeStatus_rec(pStr,p,pMatches,nShared,pStatus);
      local_50 = (uint)(iVar3 == 3) + local_50;
      pOld._4_4_ = pOld._4_4_ + 1;
      *p = *p + 1;
    }
    if (*p != pcVar4) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauMerge.c"
                    ,0x14a,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    if (pOld._4_4_ < 2) {
      __assert_fail("nTotal > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauMerge.c"
                    ,0x14b,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    if (local_50 == 0) {
      nTotal = 0;
    }
    else if (local_50 == 1) {
      nTotal = 1;
    }
    else if (local_50 < pOld._4_4_) {
      nTotal = 2;
    }
    else {
      if (local_50 != pOld._4_4_) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauMerge.c"
                      ,0x154,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
      }
      nTotal = 3;
    }
    pStatus[(long)pcVar1 - (long)pStr] = nTotal;
    pStr_local._4_4_ = nTotal;
  }
  else {
    pStr_local._4_4_ = 3;
    if (**p + -0x61 < nShared) {
      pStr_local._4_4_ = 0;
    }
    pStatus[(long)*p - (long)pStr] = pStr_local._4_4_;
  }
  return pStr_local._4_4_;
}

Assistant:

int Dau_DsdMergeStatus_rec( char * pStr, char ** p, int * pMatches, int nShared, int * pStatus )
{
    // none pure
    // 1 one pure
    // 2 two or more pure
    // 3 all pure
    if ( **p == '!' )
    {
        pStatus[*p - pStr] = -1;
        (*p)++;
    }
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        pStatus[*p - pStr] = -1;
        (*p)++;
    }
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[ *p - pStr ];
        if ( *(q+1) == '{' )
        {
            char * pTemp = *p;
            *p = q+1;
            for ( ; pTemp < q+1; pTemp++ )
                pStatus[pTemp - pStr] = -1;
        }
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return pStatus[*p - pStr] = (**p - 'a' < nShared) ? 0 : 3;
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int Status, nPure = 0, nTotal = 0;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Status = Dau_DsdMergeStatus_rec( pStr, p, pMatches, nShared, pStatus );
            nPure += (Status == 3);
            nTotal++;
        }
        assert( *p == q );
        assert( nTotal > 1 );
        if ( nPure == 0 )
            Status = 0;
        else if ( nPure == 1 )
            Status = 1;
        else if ( nPure < nTotal )
            Status = 2;
        else if ( nPure == nTotal ) 
            Status = 3;
        else assert( 0 );
        return (pStatus[pOld - pStr] = Status);
    }
    assert( 0 );
    return 0;
}